

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  int depth;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  stbi_uc sVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  stbi_uc **ppsVar15;
  char *pcVar16;
  stbi_uc *psVar17;
  byte *pbVar18;
  size_t sVar19;
  int *piVar20;
  ulong uVar21;
  stbi_uc *psVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  uint color;
  long lVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  stbi_uc *psVar30;
  stbi__uint32 raw_len_00;
  int iVar31;
  size_t __size;
  long *in_FS_OFFSET;
  int local_514;
  stbi_uc tc [3];
  ulong local_4c8;
  stbi__uint32 raw_len;
  ulong local_4a8;
  stbi_uc *local_4a0;
  stbi_uc *local_498;
  ulong local_490;
  stbi_uc *local_488;
  stbi__context *local_480;
  size_t local_478;
  int local_470;
  int local_46c;
  ulong local_468;
  long local_460;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar10 = stbi__check_png_header(s);
  if (iVar10 == 0) {
    local_514 = 0;
  }
  else {
    local_514 = 1;
    if (scan != 1) {
      ppsVar15 = &z->idata;
      bVar4 = true;
      local_468 = 0;
      color = 0;
      bVar5 = false;
      local_4c8 = 0;
      __size = 0;
      local_4a8 = 0;
      bVar6 = false;
      bVar7 = 0;
      do {
        iVar10 = stbi__get16be(s);
        uVar11 = stbi__get16be(s);
        uVar14 = iVar10 * 0x10000 + uVar11;
        uVar12 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        uVar24 = uVar12 << 0x10 | uVar13;
        uVar27 = (uint)local_4c8;
        if ((int)uVar24 < 0x49484452) {
          if (uVar24 == 0x43674249) {
            bVar5 = true;
LAB_00132a4e:
            stbi__skip(s,uVar14);
LAB_00132cfb:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar3 = true;
          }
          else {
            iVar10 = (int)local_4a8;
            if (uVar24 == 0x49444154) {
              if (bVar4) {
LAB_00132b2c:
                in_FS_OFFSET[-4] = (long)"first not IHDR";
                bVar4 = true;
                goto LAB_00132d2c;
              }
              if ((bVar7 != 0) && (uVar27 == 0)) {
                in_FS_OFFSET[-4] = (long)"no PLTE";
                bVar4 = false;
                local_4c8 = 0;
                goto LAB_00132d2c;
              }
              if (scan == 2) {
                local_514 = 1;
                if (bVar7 != 0) {
                  s->img_n = (uint)bVar7;
                }
                bVar4 = false;
                goto LAB_0013374a;
              }
              if (0x40000000 < uVar14) {
                pcVar16 = "IDAT size limit";
                goto LAB_00132d19;
              }
              uVar11 = uVar14 + iVar10;
              if (iVar10 <= (int)uVar11) {
                if ((uint)__size < uVar11) {
                  sVar19 = 0x1000;
                  if (0x1000 < uVar14) {
                    sVar19 = (ulong)uVar14;
                  }
                  if ((uint)__size != 0) {
                    sVar19 = __size;
                  }
                  do {
                    __size = sVar19;
                    sVar19 = (ulong)((uint)__size * 2);
                  } while ((uint)__size < uVar11);
                  psVar17 = (stbi_uc *)realloc(*ppsVar15,__size);
                  if (psVar17 == (stbi_uc *)0x0) {
                    in_FS_OFFSET[-4] = (long)"outofmem";
                    goto LAB_001337ce;
                  }
                  *ppsVar15 = psVar17;
                }
                iVar10 = stbi__getn(s,*ppsVar15 + (local_4a8 & 0xffffffff),uVar14);
                bVar4 = false;
                if (iVar10 != 0) {
                  local_4a8 = (ulong)uVar11;
                  goto LAB_00132cfb;
                }
                in_FS_OFFSET[-4] = (long)"outofdata";
              }
LAB_001337ce:
              bVar4 = false;
              local_514 = 0;
              bVar3 = false;
            }
            else {
              if (uVar24 != 0x49454e44) {
LAB_00132a88:
                if (bVar4) goto LAB_00132b2c;
                bVar4 = false;
                if ((uVar12 >> 0xd & 1) == 0) {
                  stbi__parse_png_file::invalid_chunk[0] = (char)(uVar24 >> 0x18);
                  stbi__parse_png_file::invalid_chunk[1] = (char)(uVar24 >> 0x10);
                  stbi__parse_png_file::invalid_chunk[2] = (char)(uVar13 >> 8);
                  stbi__parse_png_file::invalid_chunk[3] = (char)uVar13;
                  pcVar16 = stbi__parse_png_file::invalid_chunk;
                  goto LAB_00132d19;
                }
                goto LAB_00132a4e;
              }
              if (bVar4) {
                pcVar16 = "first not IHDR";
LAB_0013298f:
                in_FS_OFFSET[-4] = (long)pcVar16;
                local_514 = 0;
              }
              else if (scan == 0) {
                if (*ppsVar15 == (stbi_uc *)0x0) {
                  pcVar16 = "no IDAT";
                  goto LAB_0013298f;
                }
                raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
                psVar17 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*ppsVar15,iVar10,raw_len,(int *)&raw_len,(uint)!bVar5);
                z->expanded = psVar17;
                local_514 = 0;
                if (psVar17 != (stbi_uc *)0x0) {
                  free(*ppsVar15);
                  raw_len_00 = raw_len;
                  *ppsVar15 = (stbi_uc *)0x0;
                  iVar10 = s->img_n + 1;
                  if (bVar6 || (bVar7 == 0 && req_comp != 3) && iVar10 == req_comp) {
                    s->img_out_n = iVar10;
                  }
                  else {
                    s->img_out_n = s->img_n;
                  }
                  psVar17 = z->expanded;
                  iVar10 = s->img_out_n;
                  depth = z->depth;
                  iVar28 = iVar10 << (depth == 0x10);
                  x = z->s->img_x;
                  y = z->s->img_y;
                  if ((int)local_468 == 0) {
                    iVar10 = stbi__create_png_image_raw(z,psVar17,raw_len,iVar10,x,y,depth,color);
                    if (iVar10 != 0) goto LAB_001333ad;
                  }
                  else {
                    local_4a0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar28,0);
                    if (local_4a0 != (stbi_uc *)0x0) {
                      local_478 = (size_t)iVar28;
                      lVar25 = 0;
                      local_470 = iVar28;
                      do {
                        psVar1 = z->s;
                        local_498 = (stbi_uc *)(long)(int)(&DAT_0015e550)[lVar25];
                        uVar14 = (&DAT_0015e590)[lVar25];
                        uVar27 = ~(&DAT_0015e550)[lVar25] + psVar1->img_x + uVar14;
                        uVar12 = uVar27 / uVar14;
                        uVar11 = (&DAT_0015e5b0)[lVar25];
                        local_480 = (stbi__context *)
                                    CONCAT44(local_480._4_4_,(&DAT_0015e570)[lVar25]);
                        uVar24 = ~(&DAT_0015e570)[lVar25] + psVar1->img_y + uVar11;
                        uVar13 = uVar24 / uVar11;
                        bVar2 = true;
                        if ((uVar14 <= uVar27) && (uVar11 <= uVar24)) {
                          local_46c = uVar12 * depth * psVar1->img_n;
                          local_488 = (stbi_uc *)(long)(int)uVar14;
                          local_460 = lVar25;
                          iVar28 = stbi__create_png_image_raw
                                             (z,psVar17,raw_len_00,iVar10,uVar12,uVar13,depth,color)
                          ;
                          if (iVar28 == 0) {
                            free(local_4a0);
                            bVar2 = false;
                            lVar25 = local_460;
                          }
                          else {
                            if (0 < (int)uVar13) {
                              iVar31 = (int)local_480 * local_470;
                              iVar28 = uVar11 * local_470;
                              local_498 = local_4a0 + (long)local_498 * local_478;
                              lVar25 = (long)local_488 * local_478;
                              local_490 = 0;
                              sVar19 = local_478;
                              do {
                                if (0 < (int)uVar12) {
                                  local_480 = z->s;
                                  local_488 = z->out;
                                  lVar29 = local_490 * (long)(int)uVar12;
                                  lVar26 = 0;
                                  psVar30 = local_498;
                                  do {
                                    memcpy(psVar30 + local_480->img_x * iVar31,
                                           local_488 + (lVar29 + lVar26) * sVar19,local_478);
                                    lVar26 = lVar26 + 1;
                                    psVar30 = psVar30 + lVar25;
                                    sVar19 = local_478;
                                  } while (lVar26 < (int)uVar12);
                                }
                                local_490 = local_490 + 1;
                                iVar31 = iVar31 + iVar28;
                              } while (local_490 < uVar13);
                            }
                            uVar13 = ((local_46c + 7 >> 3) + 1) * uVar13;
                            free(z->out);
                            psVar17 = psVar17 + uVar13;
                            raw_len_00 = raw_len_00 - uVar13;
                            bVar2 = true;
                            lVar25 = local_460;
                          }
                        }
                        if (!bVar2) goto LAB_0013374a;
                        lVar25 = lVar25 + 1;
                      } while (lVar25 != 7);
                      z->out = local_4a0;
LAB_001333ad:
                      if (bVar6) {
                        if (z->depth == 0x10) {
                          stbi__compute_transparency16(z,tc16,s->img_out_n);
                        }
                        else {
                          stbi__compute_transparency(z,tc,s->img_out_n);
                        }
                      }
                      if (bVar5) {
                        piVar20 = (int *)(*in_FS_OFFSET + -8);
                        if (*(int *)((long)in_FS_OFFSET + -4) == 0) {
                          piVar20 = &stbi__de_iphone_flag_global;
                        }
                        if ((*piVar20 != 0) && (2 < s->img_out_n)) {
                          stbi__de_iphone(z);
                        }
                      }
                      if (bVar7 == 0) {
                        if (bVar6) {
                          s->img_n = s->img_n + 1;
                        }
                      }
                      else {
                        s->img_n = (uint)bVar7;
                        uVar14 = (uint)bVar7;
                        if (2 < req_comp) {
                          uVar14 = req_comp;
                        }
                        s->img_out_n = uVar14;
                        psVar17 = z->out;
                        uVar11 = z->s->img_y * z->s->img_x;
                        psVar30 = (stbi_uc *)stbi__malloc_mad2(uVar11,uVar14,0);
                        if (psVar30 == (stbi_uc *)0x0) {
                          in_FS_OFFSET[-4] = (long)"outofmem";
                        }
                        else {
                          if (uVar14 == 3) {
                            if (uVar11 != 0) {
                              uVar21 = 0;
                              psVar22 = psVar30;
                              do {
                                uVar23 = (ulong)psVar17[uVar21];
                                *psVar22 = palette[uVar23 * 4];
                                psVar22[1] = palette[uVar23 * 4 + 1];
                                psVar22[2] = palette[uVar23 * 4 + 2];
                                psVar22 = psVar22 + 3;
                                uVar21 = uVar21 + 1;
                              } while (uVar11 != uVar21);
                            }
                          }
                          else if (uVar11 != 0) {
                            uVar21 = 0;
                            do {
                              uVar23 = (ulong)psVar17[uVar21];
                              psVar30[uVar21 * 4] = palette[uVar23 * 4];
                              psVar30[uVar21 * 4 + 1] = palette[uVar23 * 4 + 1];
                              psVar30[uVar21 * 4 + 2] = palette[uVar23 * 4 + 2];
                              psVar30[uVar21 * 4 + 3] = palette[uVar23 * 4 + 3];
                              uVar21 = uVar21 + 1;
                            } while (uVar11 != uVar21);
                          }
                          free(psVar17);
                          z->out = psVar30;
                        }
                        if (psVar30 == (stbi_uc *)0x0) goto LAB_0013374a;
                      }
                      free(z->expanded);
                      z->expanded = (stbi_uc *)0x0;
                      stbi__get16be(s);
                      stbi__get16be(s);
                      goto LAB_00132b96;
                    }
                    in_FS_OFFSET[-4] = (long)"outofmem";
                  }
                }
              }
              else {
LAB_00132b96:
                local_514 = 1;
              }
LAB_0013374a:
              bVar3 = false;
            }
          }
        }
        else if (uVar24 == 0x74524e53) {
          if (bVar4) {
            in_FS_OFFSET[-4] = (long)"first not IHDR";
            bVar4 = true;
LAB_00132b74:
            local_514 = 0;
          }
          else {
            if (*ppsVar15 != (stbi_uc *)0x0) {
              pcVar16 = "tRNS after IDAT";
LAB_00132b61:
              in_FS_OFFSET[-4] = (long)pcVar16;
              bVar4 = false;
              goto LAB_00132b74;
            }
            if (bVar7 == 0) {
              uVar11 = s->img_n;
              if ((uVar11 & 1) == 0) {
                pcVar16 = "tRNS with alpha";
              }
              else {
                if (uVar11 * 2 == uVar14) {
                  if (scan == 2) {
                    s->img_n = uVar11 + 1;
                    local_514 = 1;
                    bVar6 = true;
                    bVar4 = false;
                    bVar7 = 0;
                    goto LAB_00132b81;
                  }
                  bVar6 = true;
                  if (z->depth == 0x10) {
                    if (0 < s->img_n) {
                      lVar25 = 0;
                      do {
                        iVar10 = stbi__get16be(s);
                        tc16[lVar25] = (stbi__uint16)iVar10;
                        lVar25 = lVar25 + 1;
                      } while (lVar25 < s->img_n);
                      bVar4 = false;
                      bVar7 = 0;
                      goto LAB_00132cfb;
                    }
                  }
                  else if (0 < s->img_n) {
                    lVar25 = 0;
                    do {
                      iVar10 = stbi__get16be(s);
                      tc[lVar25] = ""[z->depth] * (char)iVar10;
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < s->img_n);
                  }
                  bVar9 = 0;
LAB_00133828:
                  bVar7 = bVar9;
                  bVar4 = false;
                  goto LAB_00132cfb;
                }
                pcVar16 = "bad tRNS len";
              }
              in_FS_OFFSET[-4] = (long)pcVar16;
              bVar4 = false;
              bVar7 = 0;
              local_514 = 0;
            }
            else {
              if (scan != 2) {
                if (uVar27 == 0) {
                  in_FS_OFFSET[-4] = (long)"tRNS before PLTE";
                  bVar4 = false;
                  local_4c8 = 0;
                  goto LAB_00132b74;
                }
                if (uVar14 <= uVar27) {
                  bVar7 = 4;
                  bVar4 = false;
                  bVar9 = 4;
                  if (uVar14 == 0) goto LAB_00133828;
                  uVar21 = 0;
                  do {
                    psVar17 = s->img_buffer;
                    if (psVar17 < s->img_buffer_end) {
LAB_001334b5:
                      s->img_buffer = psVar17 + 1;
                      sVar8 = *psVar17;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar17 = s->img_buffer;
                        goto LAB_001334b5;
                      }
                      sVar8 = '\0';
                    }
                    palette[uVar21 * 4 + 3] = sVar8;
                    uVar21 = uVar21 + 1;
                  } while (uVar11 + iVar10 * 0x10000 != uVar21);
                  goto LAB_00132cfb;
                }
                pcVar16 = "bad tRNS len";
                goto LAB_00132b61;
              }
              s->img_n = 4;
              local_514 = 1;
              bVar4 = false;
            }
          }
LAB_00132b81:
          bVar3 = false;
        }
        else {
          if (uVar24 == 0x504c5445) {
            if (bVar4) goto LAB_00132b2c;
            if ((uVar14 < 0x301) &&
               (local_4c8 = (ulong)uVar11 * 0x55555556 >> 0x20,
               (int)((ulong)uVar11 * 0x55555556 >> 0x20) * 3 == uVar14)) {
              bVar4 = false;
              if (2 < uVar11) {
                uVar21 = 0;
                do {
                  psVar17 = s->img_buffer;
                  if (psVar17 < s->img_buffer_end) {
LAB_00132c1d:
                    s->img_buffer = psVar17 + 1;
                    sVar8 = *psVar17;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar17 = s->img_buffer;
                      goto LAB_00132c1d;
                    }
                    sVar8 = '\0';
                  }
                  palette[uVar21 * 4] = sVar8;
                  psVar17 = s->img_buffer;
                  if (psVar17 < s->img_buffer_end) {
LAB_00132c57:
                    s->img_buffer = psVar17 + 1;
                    sVar8 = *psVar17;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar17 = s->img_buffer;
                      goto LAB_00132c57;
                    }
                    sVar8 = '\0';
                  }
                  palette[uVar21 * 4 + 1] = sVar8;
                  psVar17 = s->img_buffer;
                  if (psVar17 < s->img_buffer_end) {
LAB_00132c91:
                    s->img_buffer = psVar17 + 1;
                    sVar8 = *psVar17;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar17 = s->img_buffer;
                      goto LAB_00132c91;
                    }
                    sVar8 = '\0';
                  }
                  palette[uVar21 * 4 + 2] = sVar8;
                  palette[uVar21 * 4 + 3] = 0xff;
                  uVar21 = uVar21 + 1;
                } while (local_4c8 != uVar21);
              }
              goto LAB_00132cfb;
            }
            pcVar16 = "invalid PLTE";
LAB_00132d19:
            in_FS_OFFSET[-4] = (long)pcVar16;
            bVar4 = false;
LAB_00132d2c:
            bVar3 = false;
            local_514 = 0;
            goto LAB_0013374c;
          }
          if (uVar24 != 0x49484452) goto LAB_00132a88;
          if (bVar4) {
            if (uVar14 != 0xd) {
              pcVar16 = "bad IHDR len";
              goto LAB_00132cd3;
            }
            iVar10 = stbi__get16be(s);
            uVar14 = stbi__get16be(s);
            s->img_x = uVar14 | iVar10 << 0x10;
            iVar10 = stbi__get16be(s);
            uVar14 = stbi__get16be(s);
            uVar14 = uVar14 | iVar10 << 0x10;
            s->img_y = uVar14;
            if ((0x1000000 < uVar14) || (0x1000000 < s->img_x)) {
              pcVar16 = "too large";
              goto LAB_00132cd3;
            }
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_00132e9e:
              s->img_buffer = pbVar18 + 1;
              bVar9 = *pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar18 = s->img_buffer;
                goto LAB_00132e9e;
              }
              bVar9 = 0;
            }
            z->depth = (uint)bVar9;
            if ((0x10 < bVar9) || ((0x10116U >> (bVar9 & 0x1f) & 1) == 0)) {
              pcVar16 = "1/2/4/8/16-bit only";
              goto LAB_00132cd3;
            }
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_00132ef5:
              s->img_buffer = pbVar18 + 1;
              color = (uint)*pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar18 = s->img_buffer;
                goto LAB_00132ef5;
              }
              color = 0;
            }
            if ((byte)color < 7) {
              if (color != 3) {
                bVar9 = bVar7;
                if ((color & 1) == 0) goto LAB_00133414;
                goto LAB_00132f14;
              }
              bVar9 = 3;
              if (z->depth == 0x10) {
                in_FS_OFFSET[-4] = (long)"bad ctype";
                color = 3;
                goto LAB_00132f26;
              }
LAB_00133414:
              bVar7 = bVar9;
              psVar17 = s->img_buffer;
              if (psVar17 < s->img_buffer_end) {
LAB_00133443:
                s->img_buffer = psVar17 + 1;
                if (*psVar17 == '\0') goto LAB_00133531;
                pcVar16 = "bad comp method";
LAB_001338ab:
                in_FS_OFFSET[-4] = (long)pcVar16;
                bVar2 = false;
                local_514 = 0;
                goto LAB_00132ce6;
              }
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar17 = s->img_buffer;
                goto LAB_00133443;
              }
LAB_00133531:
              sVar8 = stbi__get8(s);
              if (sVar8 != '\0') {
                pcVar16 = "bad filter method";
                goto LAB_001338ab;
              }
              bVar9 = stbi__get8(s);
              local_468 = (ulong)bVar9;
              if (1 < bVar9) {
                pcVar16 = "bad interlace method";
                goto LAB_001338ab;
              }
              uVar14 = s->img_x;
              if ((uVar14 == 0) || (uVar11 = s->img_y, uVar11 == 0)) {
                pcVar16 = "0-pixel image";
                goto LAB_001338ab;
              }
              if (bVar7 != 0) {
                s->img_n = 1;
                if ((uint)(0x40000000 / (ulong)uVar14 >> 2) < uVar11) {
                  in_FS_OFFSET[-4] = (long)"too large";
                  goto LAB_00132cde;
                }
LAB_0013391b:
                bVar2 = true;
                goto LAB_00132ce6;
              }
              uVar12 = (3 < (byte)color) + 1 + (color & 2);
              s->img_n = uVar12;
              if (uVar11 <= (uint)((0x40000000 / (ulong)uVar14) / (ulong)uVar12)) goto LAB_0013391b;
              in_FS_OFFSET[-4] = (long)"too large";
              bVar7 = 0;
              goto LAB_00132cde;
            }
LAB_00132f14:
            in_FS_OFFSET[-4] = (long)"bad ctype";
LAB_00132f26:
            bVar2 = false;
            local_514 = 0;
          }
          else {
            pcVar16 = "multiple IHDR";
LAB_00132cd3:
            in_FS_OFFSET[-4] = (long)pcVar16;
LAB_00132cde:
            bVar2 = false;
            local_514 = 0;
          }
LAB_00132ce6:
          bVar4 = false;
          bVar3 = false;
          if (bVar2) goto LAB_00132cfb;
        }
LAB_0013374c:
      } while (bVar3);
    }
  }
  return local_514;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}